

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator%(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  value_type_conflict1 *__val;
  BN local_50;
  BN local_38;
  
  local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(2);
  local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(2);
  local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  divmod(this,bn,&local_50,&local_38);
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator % (const BN& bn)const
{
    BN div;
    BN mod;
    divmod(bn, div, mod);
    return move(mod);
}